

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall google::LogMessage::SaveOrSendToLog(LogMessage *this)

{
  ulong uVar1;
  LogMessageData *pLVar2;
  size_t sVar3;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pLVar2 = this->data_;
  this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
            (pLVar2->field_6).sink_;
  if (this_00 != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
    sVar3 = pLVar2->num_chars_to_log_;
    if ((sVar3 == 0) || (pLVar2->message_text_[sVar3 - 1] != '\n')) {
      RawLog__(FATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
               ,0x76b,"Check %s failed: %s",
               "data_->num_chars_to_log_ > 0 && data_->message_text_[data_->num_chars_to_log_ - 1] == \'\\n\'"
               ,"");
      pLVar2 = this->data_;
      this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                (pLVar2->field_6).sink_;
      sVar3 = pLVar2->num_chars_to_log_;
    }
    uVar1 = pLVar2->num_prefix_chars_;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,pLVar2->message_text_ + uVar1,
               pLVar2->message_text_ + ~uVar1 + sVar3 + uVar1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_00,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  SendToLog(this);
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  if (data_->outvec_ != nullptr) {
    RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
                   data_->message_text_[data_->num_chars_to_log_ - 1] == '\n',
               "");
    // Omit prefix of message and trailing newline when recording in outvec_.
    const char* start = data_->message_text_ + data_->num_prefix_chars_;
    size_t len = data_->num_chars_to_log_ - data_->num_prefix_chars_ - 1;
    data_->outvec_->push_back(string(start, len));
  } else {
    SendToLog();
  }
}